

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::anon_unknown_20::ReadBinaryDataArrayHead
               (char **data,char *end,char *type,uint32_t *count,Element *el)

{
  allocator local_31;
  string local_30;
  
  if (4 < (ulong)((long)end - (long)*data)) {
    *type = **data;
    *count = *(uint32_t *)(*data + 1);
    *data = *data + 5;
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_30,
             "binary data array is too short, need five (5) bytes for type signature and element count"
             ,&local_31);
  anon_unknown.dwarf_1e32c8::ParseError(&local_30,el);
}

Assistant:

void ReadBinaryDataArrayHead(const char*& data, const char* end, char& type, uint32_t& count,
    const Element& el)
{
    if (static_cast<size_t>(end-data) < 5) {
        ParseError("binary data array is too short, need five (5) bytes for type signature and element count",&el);
    }

    // data type
    type = *data;

    // read number of elements
    BE_NCONST uint32_t len = SafeParse<uint32_t>(data+1, end);
    AI_SWAP4(len);

    count = len;
    data += 5;
}